

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

uint64_t internal_exr_huf_decompress_spare_bytes(void)

{
  uint64_t ret;
  
  return 0xc0008;
}

Assistant:

uint64_t
internal_exr_huf_decompress_spare_bytes (void)
{
    uint64_t ret = 0;
    ret += HUF_ENCSIZE * sizeof (uint64_t); // freq
    ret += HUF_DECSIZE * sizeof (HufDec);   // hdec
    //    ret += HUF_ENCSIZE * sizeof (uint64_t*); // fheap
    //    ret += HUF_ENCSIZE * sizeof (uint64_t);  // scode
    if (sizeof (FastHufDecoder) > ret) ret = sizeof (FastHufDecoder);
    return ret;
}